

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casDec.c
# Opt level: O2

int CreateDecomposedNetwork
              (DdManager *dd,DdNode *aFunc,char **pNames,int nNames,char *FileName,int nLutSize,
              int fCheck,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  abctime aVar5;
  LUT *pLVar6;
  DdNode **ppDVar7;
  DdNode *pDVar8;
  ulong uVar9;
  DdNode *pDVar10;
  DdNode *n;
  abctime aVar11;
  abctime aVar12;
  int *piVar13;
  FILE *__stream;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int c;
  int iVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  size_t __size;
  int *in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  uint local_28c;
  DdNode *aFunc_local;
  DdNode *bCVars [32];
  DdNode *bVars [32];
  
  uVar20 = (ulong)(uint)nNames;
  s_LutSize = nLutSize;
  aFunc_local = aFunc;
  aVar5 = Abc_Clock();
  Extra_ProfileWidth(dd,aFunc,CreateDecomposedNetwork::Profile,-1);
  iVar19 = s_LutSize;
  iVar4 = 0;
  uVar22 = 1;
  uVar9 = 0;
  uVar18 = uVar20;
  do {
    uVar17 = uVar9;
    uVar15 = uVar22;
    pLVar6 = (LUT *)calloc(1,0x38);
    iVar2 = (int)uVar18;
    iVar16 = iVar2 + iVar4;
    if (iVar19 < iVar16) {
      pLVar6->nIns = iVar19;
      pLVar6->nInsP = iVar4;
      uVar14 = (iVar4 - iVar19) + iVar2;
      iVar4 = CreateDecomposedNetwork::Profile[(int)(nNames - uVar14)];
      uVar22 = (ulong)iVar4;
      pLVar6->nCols = iVar4;
      if (1 < uVar22) {
        uVar3 = iVar4 - 1;
        iVar4 = 0;
        for (; uVar3 != 0; uVar3 = uVar3 >> 1) {
          iVar4 = iVar4 + 1;
        }
      }
      pLVar6->nMulti = iVar4;
      pLVar6->Level = nNames - iVar2;
      __size = uVar22 << 3;
      uVar18 = (ulong)uVar14;
    }
    else {
      pLVar6->nIns = iVar16;
      pLVar6->nInsP = iVar4;
      pLVar6->nCols = 2;
      pLVar6->nMulti = 1;
      pLVar6->Level = nNames - iVar2;
      uVar18 = 0;
      __size = 0x10;
      iVar4 = 1;
    }
    if (iVar19 <= iVar4) {
      puts("The LUT size is too small");
      return 0;
    }
    ppDVar7 = (DdNode **)malloc(__size);
    pLVar6->pbCols = ppDVar7;
    ppDVar7 = (DdNode **)malloc(__size);
    pLVar6->pbCodes = ppDVar7;
    ppDVar7 = (DdNode **)malloc(__size);
    pLVar6->paNodes = ppDVar7;
    CreateDecomposedNetwork::pLuts[uVar17] = pLVar6;
    uVar22 = (ulong)((int)uVar15 + 1);
    uVar9 = uVar17 + 1;
  } while (iVar19 < iVar16);
  for (lVar21 = 0; lVar21 < iVar19; lVar21 = lVar21 + 1) {
    pDVar8 = Cudd_bddNewVar(dd);
    bCVars[lVar21] = pDVar8;
    iVar19 = s_LutSize;
  }
  s_EncodingTime = 0;
  uVar22 = 0;
  local_28c = 0;
  uVar14 = 0;
  do {
    if (uVar22 == uVar15) {
      if (fVerbose != 0) {
        printf("LUTs: Total = %5d. Final = %5d. Simple = %5d. (%6.2f %%)  ",
               ((double)(int)(local_28c - uVar14) * 100.0) / (double)(int)local_28c,(ulong)local_28c
               ,(ulong)uVar14);
        printf("Memory = %6.2f MB\n",
               (double)(1 << ((byte)nLutSize & 0x1f)) * (double)(int)uVar14 * 9.5367431640625e-07);
        aVar11 = Abc_Clock();
        printf("Pure decomposition time   = %.2f sec\n",
               (double)((float)(aVar11 - (aVar5 + s_EncodingTime)) / 1e+06));
        printf("Encoding time             = %.2f sec\n",(double)((float)s_EncodingTime / 1e+06));
      }
      aVar5 = Abc_Clock();
      if (fCheck != 0) {
        __stream = fopen(FileName,"w");
        fprintf(__stream,".model %s\n",FileName);
        fwrite(".inputs",7,1,__stream);
        if (nNames < 1) {
          uVar20 = 0;
        }
        for (uVar22 = 0; iVar4 = (int)in_stack_fffffffffffffd48, uVar20 != uVar22;
            uVar22 = uVar22 + 1) {
          fprintf(__stream," %s",pNames[uVar22]);
        }
        fputc(10,__stream);
        fwrite(".outputs F",10,1,__stream);
        fputc(10,__stream);
        WriteLUTSintoBLIFfile
                  ((FILE *)__stream,dd,CreateDecomposedNetwork::pLuts,(int)(uVar17 + 1),bCVars,
                   pNames,iVar4,
                   (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        fwrite(".end\n",5,1,__stream);
        fclose(__stream);
        if (fVerbose != 0) {
          aVar11 = Abc_Clock();
          printf("Output file writing time  = %.2f sec\n",(double)((float)(aVar11 - aVar5) / 1e+06))
          ;
        }
      }
      for (uVar22 = 0; uVar22 != uVar15; uVar22 = uVar22 + 1) {
        pLVar6 = CreateDecomposedNetwork::pLuts[uVar22];
        for (lVar21 = 0; lVar21 < pLVar6->nCols; lVar21 = lVar21 + 1) {
          Cudd_RecursiveDeref(dd,pLVar6->pbCols[lVar21]);
          Cudd_RecursiveDeref(dd,pLVar6->pbCodes[lVar21]);
          Cudd_RecursiveDeref(dd,pLVar6->paNodes[lVar21]);
        }
        Cudd_RecursiveDeref(dd,pLVar6->bRelation);
        if (pLVar6->pbCols != (DdNode **)0x0) {
          free(pLVar6->pbCols);
          pLVar6->pbCols = (DdNode **)0x0;
        }
        if (pLVar6->pbCodes != (DdNode **)0x0) {
          free(pLVar6->pbCodes);
          pLVar6->pbCodes = (DdNode **)0x0;
        }
        free(pLVar6->paNodes);
        free(pLVar6);
      }
      return 1;
    }
    pLVar6 = CreateDecomposedNetwork::pLuts[uVar22];
    uVar3 = (pLVar6->nIns + pLVar6->Level) - pLVar6->nInsP;
    if (uVar22 == 0) {
      in_stack_fffffffffffffd48 = (int *)(ulong)uVar3;
      iVar4 = Extra_bddNodePathsUnderCutArray
                        (dd,&aFunc_local,&dd->one,1,pLVar6->paNodes,pLVar6->pbCols,uVar3);
    }
    else {
      lVar21 = (&DAT_00c6ef68)[uVar22];
      in_stack_fffffffffffffd48 = (int *)(ulong)uVar3;
      iVar4 = Extra_bddNodePathsUnderCutArray
                        (dd,*(DdNode ***)(lVar21 + 0x28),*(DdNode ***)(lVar21 + 0x20),
                         *(int *)(lVar21 + 8),pLVar6->paNodes,pLVar6->pbCols,uVar3);
    }
    if (iVar4 != pLVar6->nCols) {
      __assert_fail("RetValue == p->nCols",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cas/casDec.c"
                    ,0xf6,
                    "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                   );
    }
    uVar3 = pLVar6->nInsP;
    uVar9 = 0;
    if (0 < (int)uVar3) {
      uVar9 = (ulong)uVar3;
    }
    for (uVar18 = 0; uVar9 != uVar18; uVar18 = uVar18 + 1) {
      bVars[uVar18] = dd->vars[dd->invperm[uVar18]];
    }
    pDVar8 = Extra_bddBitsToCube(dd,~(-1 << ((byte)uVar3 & 0x1f)),uVar3,bVars,1);
    Cudd_Ref(pDVar8);
    uVar3 = pLVar6->nIns - pLVar6->nInsP;
    uVar9 = 0;
    if (0 < (int)uVar3) {
      uVar9 = (ulong)uVar3;
    }
    for (uVar18 = 0; uVar9 != uVar18; uVar18 = uVar18 + 1) {
      bVars[uVar18] = dd->vars[dd->invperm[(long)pLVar6->Level + uVar18]];
    }
    pDVar10 = Extra_bddBitsToCube(dd,~(-1 << ((byte)uVar3 & 0x1f)),uVar3,bVars,1);
    Cudd_Ref(pDVar10);
    n = Cudd_bddAnd(dd,pDVar10,pDVar8);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,pDVar10);
    Cudd_RecursiveDeref(dd,pDVar8);
    if (uVar22 == (uVar17 & 0xffffffff)) {
      if (pLVar6->nMulti != 1) {
        __assert_fail("p->nMulti == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cas/casDec.c"
                      ,0x115,
                      "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                     );
      }
      if (pLVar6->nCols != 2) {
        __assert_fail("p->nCols == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cas/casDec.c"
                      ,0x116,
                      "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                     );
      }
      pDVar8 = *pLVar6->paNodes;
      if (*(int *)((ulong)pDVar8 & 0xfffffffffffffffe) != 0x7fffffff) {
        __assert_fail("Cudd_IsConstant( p->paNodes[0] )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cas/casDec.c"
                      ,0x117,
                      "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                     );
      }
      if (*(int *)((ulong)pLVar6->paNodes[1] & 0xfffffffffffffffe) != 0x7fffffff) {
        __assert_fail("Cudd_IsConstant( p->paNodes[1] )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cas/casDec.c"
                      ,0x118,
                      "int CreateDecomposedNetwork(DdManager *, DdNode *, char **, int, char *, int, int, int)"
                     );
      }
      pDVar10 = (DdNode *)((ulong)bCVars[0] ^ 1);
      if (pDVar8 == dd->one) {
        pDVar10 = bCVars[0];
      }
      pDVar8 = Cudd_bddIte(dd,pDVar10,*pLVar6->pbCols,pLVar6->pbCols[1]);
      pLVar6->bRelation = pDVar8;
      Cudd_Ref(pDVar8);
    }
    else {
      aVar11 = Abc_Clock();
      in_stack_fffffffffffffd48 = &pLVar6->nSimple;
      pDVar8 = Extra_bddEncodingNonStrict
                         (dd,pLVar6->pbCols,pLVar6->nCols,n,bCVars,pLVar6->nMulti,
                          in_stack_fffffffffffffd48);
      pLVar6->bRelation = pDVar8;
      Cudd_Ref(pDVar8);
      aVar12 = Abc_Clock();
      s_EncodingTime = s_EncodingTime + (aVar12 - aVar11);
    }
    uVar3 = pLVar6->nMulti;
    uVar1 = pLVar6->nSimple;
    if (fVerbose != 0) {
      in_stack_fffffffffffffd50 = pLVar6->Level;
      in_stack_fffffffffffffd48 = (int *)(ulong)uVar1;
      printf("Stage %3d: In = %3d  InP = %3d  Cols = %5d  Multi = %2d  Simple = %2d  Level = %3d\n",
             (ulong)((int)uVar22 + 1),(ulong)(uint)pLVar6->nIns,(ulong)(uint)pLVar6->nInsP,
             (ulong)(uint)pLVar6->nCols,(ulong)uVar3);
    }
    uVar14 = (uVar14 + uVar3) - uVar1;
    local_28c = local_28c + uVar3;
    for (lVar21 = 0; lVar21 < pLVar6->nCols; lVar21 = lVar21 + 1) {
      pDVar8 = Cudd_bddAndAbstract(dd,pLVar6->bRelation,pLVar6->pbCols[lVar21],n);
      pLVar6->pbCodes[lVar21] = pDVar8;
      Cudd_Ref(pLVar6->pbCodes[lVar21]);
    }
    Cudd_RecursiveDeref(dd,n);
    ppDVar7 = (DdNode **)malloc((long)pLVar6->nCols << 3);
    piVar13 = CreateDecomposedNetwork::Permute;
    for (lVar21 = 0; lVar21 < dd->size; lVar21 = lVar21 + 1) {
      *piVar13 = (int)lVar21;
      piVar13 = piVar13 + 1;
    }
    for (lVar21 = 0; lVar21 < pLVar6->nMulti; lVar21 = lVar21 + 1) {
      CreateDecomposedNetwork::Permute[bCVars[lVar21]->index] = dd->invperm[lVar21];
    }
    Extra_bddPermuteArray(dd,pLVar6->pbCodes,ppDVar7,pLVar6->nCols,CreateDecomposedNetwork::Permute)
    ;
    for (lVar21 = 0; lVar21 < pLVar6->nCols; lVar21 = lVar21 + 1) {
      Cudd_RecursiveDeref(dd,pLVar6->pbCodes[lVar21]);
      pLVar6->pbCodes[lVar21] = ppDVar7[lVar21];
    }
    free(ppDVar7);
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

int CreateDecomposedNetwork( DdManager * dd, DdNode * aFunc, char ** pNames, int nNames, char * FileName, int nLutSize, int fCheck, int fVerbose )
// aFunc is a 0-1 ADD for the given function
// pNames (nNames) are the input variable names
// FileName is the name of the output file for the LUT network
// dynamic variable reordering should be disabled when this function is running
{
    static LUT * pLuts[MAXINPUTS];   // the LUT cascade
    static int Profile[MAXINPUTS];   // the profile filled in with the info about the BDD width
    static int Permute[MAXINPUTS];   // the array to store a temporary permutation of variables

    LUT * p;               // the current LUT
    int i, v;

    DdNode * bCVars[32];   // these are variables for the codes

    int nVarsRem;          // the number of remaining variables
    int PrevMulti;         // column multiplicity on the previous level
    int fLastLut;          // flag to signal the last LUT
    int nLuts;
    int nLutsTotal = 0;
    int nLutOutputs = 0;
    int nLutOutputsOrig = 0;

    abctime clk1;

    s_LutSize = nLutSize;

    s_nFuncVars = nNames;

    // get the profile
    clk1 = Abc_Clock();
    Extra_ProfileWidth( dd, aFunc, Profile, -1 );


//  for ( v = 0; v < nNames; v++ )
//      printf( "Level = %2d, Width = %2d\n", v+1, Profile[v] );


//printf( "\n" );

    // mark-up the LUTs
    // assuming that the manager has exactly nNames vars (new vars have not been introduced yet)
    nVarsRem  = nNames;     // the number of remaining variables
    PrevMulti = 0;          // column multiplicity on the previous level
    fLastLut  = 0;
    nLuts     = 0;
    do
    {
        p = (LUT*) ABC_ALLOC( char, sizeof(LUT) );
        memset( p, 0, sizeof(LUT) );

        if ( nVarsRem + PrevMulti <= s_LutSize ) // this is the last LUT
        {
            p->nIns   = nVarsRem + PrevMulti;
            p->nInsP  = PrevMulti;
            p->nCols  = 2;
            p->nMulti = 1;
            p->Level  = nNames-nVarsRem;

            nVarsRem  = 0;
            PrevMulti = 1;

            fLastLut  = 1;
        }
        else // this is not the last LUT
        {
            p->nIns   = s_LutSize;
            p->nInsP  = PrevMulti;
            p->nCols  = Profile[nNames-(nVarsRem-(s_LutSize-PrevMulti))];
            p->nMulti = Abc_Base2Log(p->nCols);
            p->Level  = nNames-nVarsRem;

            nVarsRem  = nVarsRem-(s_LutSize-PrevMulti);
            PrevMulti = p->nMulti;
        }
        
        if ( p->nMulti >= s_LutSize )
        {
            printf( "The LUT size is too small\n" );
            return 0;
        }

        nLutOutputsOrig += p->nMulti;


//if ( fVerbose )
//printf( "Stage %2d: In = %3d, InP = %3d, Cols = %5d, Multi = %2d, Level = %2d\n", 
//       nLuts+1, p->nIns, p->nInsP, p->nCols, p->nMulti, p->Level );


        // there should be as many columns, codes, and nodes, as there are columns on this level
        p->pbCols  = (DdNode **) ABC_ALLOC( char, p->nCols * sizeof(DdNode *) );
        p->pbCodes = (DdNode **) ABC_ALLOC( char, p->nCols * sizeof(DdNode *) );
        p->paNodes = (DdNode **) ABC_ALLOC( char, p->nCols * sizeof(DdNode *) );

        pLuts[nLuts] = p;
        nLuts++;
    }
    while ( !fLastLut );


//if ( fVerbose )
//printf( "The number of cascades = %d\n", nLuts );


//fprintf( pTable, "%d ", nLuts );


    // add the new variables at the bottom
    for ( i = 0; i < s_LutSize; i++ )
        bCVars[i] = Cudd_bddNewVar(dd);

    // for each LUT - assign the LUT and encode the columns
    s_EncodingTime = 0;
    for ( i = 0; i < nLuts; i++ )
    {
        int RetValue;
        DdNode * bVars[32];    
        int nVars;
        DdNode * bVarsInCube;
        DdNode * bVarsCCube;
        DdNode * bVarsCube;
        int CutLevel;

        p = pLuts[i];

        // compute the columns of this LUT starting from the given set of nodes with the given codes
        // (these codes have been remapped to depend on the topmost variables in the manager)
        // for the first LUT, start with the constant 1 BDD
        CutLevel = p->Level + p->nIns - p->nInsP;
        if ( i == 0 )
            RetValue = Extra_bddNodePathsUnderCutArray( 
                            dd, &aFunc, &(b1), 1, 
                            p->paNodes, p->pbCols, CutLevel );
        else
            RetValue = Extra_bddNodePathsUnderCutArray( 
                            dd, pLuts[i-1]->paNodes, pLuts[i-1]->pbCodes, pLuts[i-1]->nCols, 
                            p->paNodes, p->pbCols, CutLevel );
        assert( RetValue == p->nCols );
        // at this point, we have filled out p->paNodes[] and p->pbCols[] of this LUT
        // pLuts[i-1]->paNodes depended on normal vars
        // pLuts[i-1]->pbCodes depended on the topmost variables 
        // the resulting p->paNodes depend on normal ADD nodes
        // the resulting p->pbCols depend on normal vars and topmost variables in the manager

        // perform the encoding

        // create the cube of these variables
        // collect the topmost variables of the manager
        nVars = p->nInsP;
        for ( v = 0; v < nVars; v++ )
            bVars[v] = dd->vars[ dd->invperm[v] ];
        bVarsCCube  = Extra_bddBitsToCube( dd, (1<<nVars)-1, nVars, bVars, 1 );    Cudd_Ref( bVarsCCube );

        // collect the primary input variables involved in this LUT
        nVars = p->nIns - p->nInsP;
        for ( v = 0; v < nVars; v++ )
            bVars[v] = dd->vars[ dd->invperm[p->Level+v] ];
        bVarsInCube = Extra_bddBitsToCube( dd, (1<<nVars)-1, nVars, bVars, 1 );    Cudd_Ref( bVarsInCube );

        // get the cube
        bVarsCube   = Cudd_bddAnd( dd, bVarsInCube, bVarsCCube );              Cudd_Ref( bVarsCube );
        Cudd_RecursiveDeref( dd, bVarsInCube );
        Cudd_RecursiveDeref( dd, bVarsCCube );

        // get the encoding relation
        if ( i == nLuts -1 )
        {
            DdNode * bVar;
            assert( p->nMulti == 1 );
            assert( p->nCols == 2 );
            assert( Cudd_IsConstant( p->paNodes[0] ) );
            assert( Cudd_IsConstant( p->paNodes[1] ) );

            bVar = ( p->paNodes[0] == a1 )? bCVars[0]: Cudd_Not( bCVars[0] );
            p->bRelation = Cudd_bddIte( dd, bVar, p->pbCols[0], p->pbCols[1] );  Cudd_Ref( p->bRelation );
        }
        else
        {
            abctime clk2 = Abc_Clock();
//          p->bRelation = PerformTheEncoding( dd, p->pbCols, p->nCols, bVarsCube, bCVars, p->nMulti, &p->nSimple );  Cudd_Ref( p->bRelation );
            p->bRelation = Extra_bddEncodingNonStrict( dd, p->pbCols, p->nCols, bVarsCube, bCVars, p->nMulti, &p->nSimple );  Cudd_Ref( p->bRelation );
            s_EncodingTime += Abc_Clock() - clk2;
        }

        // update the number of LUT outputs
        nLutOutputs += (p->nMulti - p->nSimple);
        nLutsTotal += p->nMulti;

//if ( fVerbose )
//printf( "Stage %2d: Simple = %d\n", i+1, p->nSimple );

if ( fVerbose )
printf( "Stage %3d: In = %3d  InP = %3d  Cols = %5d  Multi = %2d  Simple = %2d  Level = %3d\n", 
       i+1, p->nIns, p->nInsP, p->nCols, p->nMulti, p->nSimple, p->Level );

        // get the codes from the relation (these are not necessarily cubes)
        {
            int c;
            for ( c = 0; c < p->nCols; c++ )
            {
                p->pbCodes[c] = Cudd_bddAndAbstract( dd, p->bRelation, p->pbCols[c], bVarsCube ); Cudd_Ref( p->pbCodes[c] );
            }
        }

        Cudd_RecursiveDeref( dd, bVarsCube );

        // remap the codes to depend on the topmost varibles of the manager
        // useful as a preparation for the next step
        {
            DdNode ** pbTemp;
            int k, v;

            pbTemp = (DdNode **) ABC_ALLOC( char, p->nCols * sizeof(DdNode *) );

            // create the identical permutation
            for ( v = 0; v < dd->size; v++ )
                Permute[v] = v;

            // use the topmost variables of the manager 
            // to represent the previous level codes
            for ( v = 0; v < p->nMulti; v++ )
                Permute[bCVars[v]->index] = dd->invperm[v];

            Extra_bddPermuteArray( dd, p->pbCodes, pbTemp, p->nCols, Permute );
            // the array pbTemp comes already referenced

            // deref the old codes and assign the new ones
            for ( k = 0; k < p->nCols; k++ )
            {
                Cudd_RecursiveDeref( dd, p->pbCodes[k] );
                p->pbCodes[k] = pbTemp[k];
            }
            ABC_FREE( pbTemp );
        }
    } 
    if ( fVerbose )
    printf( "LUTs: Total = %5d. Final = %5d. Simple = %5d. (%6.2f %%)  ", 
        nLutsTotal, nLutOutputs, nLutsTotal-nLutOutputs, 100.0*(nLutsTotal-nLutOutputs)/nLutsTotal );
    if ( fVerbose )
    printf( "Memory = %6.2f MB\n", 1.0*nLutOutputs*(1<<nLutSize)/(1<<20) );
//  printf( "\n" );

//fprintf( pTable, "%d ", nLutOutputsOrig );
//fprintf( pTable, "%d ", nLutOutputs );

    if ( fVerbose )
    {
    printf( "Pure decomposition time   = %.2f sec\n", (float)(Abc_Clock() - clk1 - s_EncodingTime)/(float)(CLOCKS_PER_SEC) );
    printf( "Encoding time             = %.2f sec\n", (float)(s_EncodingTime)/(float)(CLOCKS_PER_SEC) );
//  printf( "Encoding search time      = %.2f sec\n", (float)(s_EncSearchTime)/(float)(CLOCKS_PER_SEC) );
//  printf( "Encoding compute time     = %.2f sec\n", (float)(s_EncComputeTime)/(float)(CLOCKS_PER_SEC) );
    }


//fprintf( pTable, "%.2f ", (float)(s_ReadingTime)/(float)(CLOCKS_PER_SEC) );
//fprintf( pTable, "%.2f ", (float)(Abc_Clock() - clk1 - s_EncodingTime)/(float)(CLOCKS_PER_SEC) );
//fprintf( pTable, "%.2f ", (float)(s_EncodingTime)/(float)(CLOCKS_PER_SEC) );
//fprintf( pTable, "%.2f ", (float)(s_RemappingTime)/(float)(CLOCKS_PER_SEC) );


    // write LUTs into the BLIF file
    clk1 = Abc_Clock();
    if ( fCheck )
    {
        FILE * pFile;
        // start the file
        pFile = fopen( FileName, "w" );
        fprintf( pFile, ".model %s\n", FileName );

        fprintf( pFile, ".inputs" );
        for ( i = 0; i < nNames; i++ )
            fprintf( pFile, " %s", pNames[i] );
        fprintf( pFile, "\n" );
        fprintf( pFile, ".outputs F" );
        fprintf( pFile, "\n" );

        // write the DD into the file
        WriteLUTSintoBLIFfile( pFile, dd, pLuts, nLuts, bCVars, pNames, nNames, FileName );

        fprintf( pFile, ".end\n" );
        fclose( pFile );
        if ( fVerbose )
        printf( "Output file writing time  = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
    }


    // updo the LUT cascade
    for ( i = 0; i < nLuts; i++ )
    {
        p = pLuts[i];
        for ( v = 0; v < p->nCols; v++ )
        {
            Cudd_RecursiveDeref( dd, p->pbCols[v] );
            Cudd_RecursiveDeref( dd, p->pbCodes[v] );
            Cudd_RecursiveDeref( dd, p->paNodes[v] );
        }
        Cudd_RecursiveDeref( dd, p->bRelation );

        ABC_FREE( p->pbCols );
        ABC_FREE( p->pbCodes );
        ABC_FREE( p->paNodes );
        ABC_FREE( p );
    }

    return 1;
}